

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmTarget * __thiscall
cmLocalGenerator::AddCustomCommandToTarget
          (cmLocalGenerator *this,string *target,cmCustomCommandType type,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,
          cmObjectLibraryCommands objLibCommands)

{
  cmLocalGenerator *target_00;
  cmCustomCommandType type_00;
  pointer this_00;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_68 [3];
  cmListFileBacktrace local_50;
  cmLocalGenerator *local_40;
  cmTarget *t;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *puStack_30;
  cmObjectLibraryCommands objLibCommands_local;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc_local;
  string *psStack_20;
  cmCustomCommandType type_local;
  string *target_local;
  cmLocalGenerator *this_local;
  
  t._4_4_ = objLibCommands;
  puStack_30 = cc;
  cc_local._4_4_ = type;
  psStack_20 = target;
  target_local = (string *)this;
  local_40 = (cmLocalGenerator *)
             cmMakefile::GetCustomCommandTarget
                       (this->Makefile,target,objLibCommands,&this->DirectoryBacktrace);
  if (local_40 == (cmLocalGenerator *)0x0) {
    this_local = (cmLocalGenerator *)0x0;
  }
  else {
    this_00 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (cc);
    cmListFileBacktrace::cmListFileBacktrace(&local_50,&this->DirectoryBacktrace);
    cmCustomCommand::SetBacktrace(this_00,&local_50);
    cmListFileBacktrace::~cmListFileBacktrace(&local_50);
    type_00 = cc_local._4_4_;
    target_00 = local_40;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr(local_68,cc)
    ;
    detail::AddCustomCommandToTarget(this,Generator,(cmTarget *)target_00,type_00,local_68);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(local_68);
    this_local = local_40;
  }
  return (cmTarget *)this_local;
}

Assistant:

cmTarget* cmLocalGenerator::AddCustomCommandToTarget(
  const std::string& target, cmCustomCommandType type,
  std::unique_ptr<cmCustomCommand> cc, cmObjectLibraryCommands objLibCommands)
{
  cmTarget* t = this->Makefile->GetCustomCommandTarget(
    target, objLibCommands, this->DirectoryBacktrace);
  if (!t) {
    return nullptr;
  }

  cc->SetBacktrace(this->DirectoryBacktrace);

  detail::AddCustomCommandToTarget(*this, cmCommandOrigin::Generator, t, type,
                                   std::move(cc));

  return t;
}